

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall crnlib::dxt_hc::determine_alpha_endpoints(dxt_hc *this)

{
  long lVar1;
  float fVar2;
  ushort uVar3;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar4;
  alpha_cluster *paVar5;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar6;
  pointer __first;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar10;
  ulong uVar11;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar12;
  uint uVar13;
  long lVar14;
  uint p;
  long lVar15;
  uint t;
  ulong uVar16;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar17;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar18;
  code *pcVar19;
  _Iter_comp_val<std::less<Node>_> *__comp;
  long lVar20;
  long lVar21;
  tile_details *ptVar22;
  uint a;
  int iVar23;
  void *pvVar24;
  Node __value;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_17c;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_178;
  pointer local_170;
  vector<Node>_conflict1 nodes;
  vector<unsigned_int> weights;
  vector<crnlib::vec<2U,_float>_> vectors;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> endpoints;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  tree_clusterizer<crnlib::vec<2U,_float>_> vq;
  
  uVar8 = this->m_pTask_pool->m_num_threads;
  local_178 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)(ulong)uVar8;
  uVar8 = uVar8 + 1;
  endpoints.m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
  endpoints.m_size = 0;
  endpoints.m_capacity = 0;
  lVar20 = 0x2c;
  uVar11 = 0;
  while (uVar11 < this->m_num_alpha_blocks) {
    lVar21 = 0;
    local_170 = (pointer)uVar11;
    for (uVar16 = 0; uVar16 < (this->m_tiles).m_size; uVar16 = uVar16 + 1) {
      ptVar22 = (this->m_tiles).m_p;
      iVar23 = *(int *)((long)(ptVar22->color_endpoint).m_s + lVar21 + -0xc);
      if (iVar23 != 0) {
        vec<2U,_float>::vec((vec<2U,_float> *)&vq,
                            (vec<2U,_float> *)
                            ((long)(ptVar22->color_endpoint).m_s + lVar21 + lVar20 + -0x14));
        vq.m_weightedVectors.m_p = (vec<2U,_float> *)CONCAT44(vq.m_weightedVectors.m_p._4_4_,iVar23)
        ;
        vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::push_back
                  (&endpoints,(pair<crnlib::vec<2U,_float>,_unsigned_int> *)&vq);
      }
      lVar21 = lVar21 + 0x48;
    }
    lVar20 = lVar20 + 8;
    uVar11 = (long)local_170 + 1;
  }
  nodes.m_p = (Node *)0x0;
  nodes.m_size = 0;
  nodes.m_capacity = 0;
  local_178 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)(ulong)((int)local_178 + 2);
  pcVar19 = vector<Node>::object_mover;
  __comp = (_Iter_comp_val<std::less<Node>_> *)0x1;
  iVar23 = 0;
  ppVar17 = endpoints.m_p;
LAB_001681d6:
  uVar9 = (iVar23 + 1) * endpoints.m_size;
  while( true ) {
    ppVar18 = ppVar17;
    iVar23 = iVar23 + 1;
    if ((int)local_178 == iVar23) break;
    ppVar17 = endpoints.m_p + (ulong)uVar9 / (ulong)uVar8;
    uVar9 = uVar9 + endpoints.m_size;
    if (ppVar18 != ppVar17) goto code_r0x0016820e;
  }
  lVar20 = 0;
  for (uVar11 = 0; uVar11 < nodes.m_size; uVar11 = uVar11 + 1) {
    task_pool::queue_task
              (this->m_pTask_pool,determine_alpha_endpoints::Node::sort_task,uVar11,
               (void *)((long)&(nodes.m_p)->p + lVar20));
    lVar20 = lVar20 + 0x10;
  }
  task_pool::join(this->m_pTask_pool);
  queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lVar20 = 0;
  for (uVar11 = 0; uVar11 < nodes.m_size; uVar11 = uVar11 + 1) {
    std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
              (&queue,(value_type_conflict *)((long)&(nodes.m_p)->p + lVar20));
    lVar20 = lVar20 + 0x10;
  }
  vectors.m_p = (vec<2U,_float> *)0x0;
  vectors.m_size = 0;
  vectors.m_capacity = 0;
  weights.m_p = (uint *)0x0;
  weights.m_size = 0;
  weights.m_capacity = 0;
  vector<crnlib::vec<2U,_float>_>::reserve(&vectors,endpoints.m_size);
  vector<unsigned_int>::reserve(&weights,endpoints.m_size);
  do {
    while( true ) {
      __first = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_170 = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        vq.m_node_index_map.m_values.m_p = (raw_node *)0x0;
        vq.m_node_index_map.m_values.m_size = 0;
        vq.m_node_index_map.m_values.m_capacity = 0;
        vq.m_vectorComparison.m_p = (bool *)0x0;
        vq.m_vectorComparison.m_size = 0;
        vq.m_vectorComparison.m_capacity = 0;
        vq.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
        vq.m_vectorsInfoRight.m_size = 0;
        vq.m_vectorsInfoRight.m_capacity = 0;
        vq.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
        vq.m_vectorsInfoLeft.m_size = 0;
        vq.m_vectorsInfoLeft.m_capacity = 0;
        vq.m_vectorsInfo.m_p = (VectorInfo *)0x0;
        vq.m_vectorsInfo.m_size = 0;
        vq.m_vectorsInfo.m_capacity = 0;
        vq.m_weightedDotProducts.m_p = (double *)0x0;
        vq.m_weightedDotProducts.m_size = 0;
        vq.m_weightedDotProducts.m_capacity = 0;
        vq.m_weightedVectors.m_p = (vec<2U,_float> *)0x0;
        vq.m_weightedVectors.m_size = 0;
        vq.m_weightedVectors.m_capacity = 0;
        vq.m_node_index_map.m_hash_shift = 0x20;
        vq.m_node_index_map.m_num_valid = 0;
        vq.m_node_index_map.m_grow_threshold = 0;
        vq.m_nodes.m_p = (vq_node *)0x0;
        vq.m_nodes.m_size = 0;
        vq.m_nodes.m_capacity = 0;
        vq.m_codebook.m_p = (vec<2U,_float> *)0x0;
        vq.m_codebook.m_size = 0;
        vq.m_codebook.m_capacity = 0;
        uVar9 = (this->m_params).m_alpha_endpoint_codebook_size;
        if (this->m_num_tiles < uVar9) {
          uVar9 = this->m_num_tiles;
        }
        tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
                  (&vq,vectors.m_p,weights.m_p,vectors.m_size,uVar9,false,this->m_pTask_pool);
        local_170 = (pointer)&this->m_alpha_clusters;
        vector<crnlib::dxt_hc::alpha_cluster>::resize
                  ((vector<crnlib::dxt_hc::alpha_cluster> *)local_170,vq.m_codebook.m_size,false);
        for (pvVar24 = (void *)0x0; (void *)(ulong)uVar8 != pvVar24;
            pvVar24 = (void *)((long)pvVar24 + 1)) {
          task_pool::
          queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                    (this->m_pTask_pool,this,0x16a958,0,pvVar24);
        }
        task_pool::join(this->m_pTask_pool);
        ppVar12 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0;
        while (ppVar10 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)
                         (ulong)this->m_num_alpha_blocks, ppVar12 < ppVar10) {
          uVar9 = (this->m_params).m_alpha_component_indices[(long)ppVar12];
          local_178 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)((long)(ppVar12->first).m_s + 1)
          ;
          for (uVar11 = 0; ppVar12 = local_178, uVar11 < this->m_num_blocks; uVar11 = uVar11 + 1) {
            ptVar22 = (this->m_tiles).m_p;
            uVar13 = ptVar22[uVar11].pixels.m_size;
            if (uVar13 != 0) {
              ptVar22 = ptVar22 + uVar11;
              uVar3 = ptVar22->cluster_indices[(long)local_178];
              paVar5 = (alpha_cluster *)local_170->p;
              for (uVar16 = 0; uVar16 < uVar13; uVar16 = uVar16 + 1) {
                local_17c.field_0.g = (ptVar22->pixels).m_p[uVar16].field_0.c[uVar9];
                local_17c.field_0.r = local_17c.field_0.g;
                local_17c.field_0.b = local_17c.field_0.g;
                local_17c.field_0.a = 0xff;
                vector<crnlib::color_quad<unsigned_char,_int>_>::push_back
                          (&paVar5[uVar3].pixels,
                           (color_quad<unsigned_char,_int> *)&local_17c.field_0);
                uVar13 = (ptVar22->pixels).m_size;
              }
            }
          }
        }
        for (local_17c.m_u32 = 0; local_17c.m_u32 < this->m_num_blocks;
            local_17c.m_u32 = local_17c.m_u32 + 1) {
          lVar20 = 0x10;
          for (ppVar12 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0; ppVar12 < ppVar10;
              ppVar12 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)
                        ((long)(ppVar12->first).m_s + 1)) {
            uVar3 = (this->m_tiles).m_p[(this->m_tile_indices).m_p[local_17c.m_u32]].cluster_indices
                    [(long)((long)(ppVar12->first).m_s + 1)];
            *(ushort *)
             ((long)&(this->m_endpoint_indices).m_p[local_17c.m_u32].field_0 + (long)ppVar12 * 2 + 2
             ) = uVar3;
            if ((this->m_has_subblocks != true) || ((local_17c.m_u32 & 1) == 0)) {
              vector<unsigned_int>::push_back
                        ((vector<unsigned_int> *)
                         ((long)&((alpha_cluster *)local_170->p)[uVar3].blocks[0].m_p + lVar20),
                         (uint *)local_17c.c);
            }
            ppVar10 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)(ulong)this->m_num_alpha_blocks;
            lVar20 = lVar20 + 0x10;
          }
        }
        for (pvVar24 = (void *)0x0; (void *)(ulong)uVar8 != pvVar24;
            pvVar24 = (void *)((long)pvVar24 + 1)) {
          task_pool::
          queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                    (this->m_pTask_pool,this,0x16a3c4,0,pvVar24);
        }
        task_pool::join(this->m_pTask_pool);
        tree_clusterizer<crnlib::vec<2U,_float>_>::~tree_clusterizer(&vq);
        vector<unsigned_int>::~vector(&weights);
        vector<crnlib::vec<2U,_float>_>::~vector(&vectors);
        std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
        ~priority_queue(&queue);
        vector<Node>::~vector((vector<Node> *)&nodes);
        vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::~vector(&endpoints);
        return;
      }
      ppVar12 = (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->p;
      vq.m_weightedVectors.m_p =
           (vec<2U,_float> *)
           (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
           _M_start)->pEnd;
      lVar20 = (long)((ppVar12->first).m_s + 3);
      vq.m_vectors = (vec<2U,_float> *)lVar20;
      if (0x10 < (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_start) {
        ppVar10 = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].p;
        ppVar4 = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].pEnd;
        ppVar6 = (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start)->pEnd;
        queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].p =
             (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start)->p;
        queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].pEnd = ppVar6;
        uVar11 = (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                 (-0x10 - (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                super__Vector_impl_data._M_start);
        lVar14 = (long)uVar11 >> 4;
        lVar21 = 0;
        local_178 = ppVar12;
        while (ppVar12 = local_178, lVar21 < (lVar14 + -1) / 2) {
          lVar1 = lVar21 * 2 + 2;
          lVar15 = lVar21 * 2 + 1;
          bVar7 = std::operator<((pair<crnlib::vec<2U,_float>,_unsigned_int> *)__first[lVar15].p,
                                 (pair<crnlib::vec<2U,_float>,_unsigned_int> *)__first[lVar1].p);
          if (!bVar7) {
            lVar15 = lVar1;
          }
          ppVar12 = __first[lVar15].pEnd;
          __first[lVar21].p = __first[lVar15].p;
          __first[lVar21].pEnd = ppVar12;
          lVar21 = lVar15;
        }
        if (((uVar11 & 0x10) == 0) && (lVar21 == lVar14 + -2 >> 1)) {
          lVar14 = lVar21 * 2 + 1;
          ppVar6 = __first[lVar14].pEnd;
          __first[lVar21].p = __first[lVar14].p;
          __first[lVar21].pEnd = ppVar6;
          lVar21 = lVar14;
        }
        __value.pEnd = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)pcVar19;
        __value.p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)ppVar4;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<crnlib::dxt_hc::determine_alpha_endpoints()::Node*,std::vector<crnlib::dxt_hc::determine_alpha_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>>,long,crnlib::dxt_hc::determine_alpha_endpoints()::Node,__gnu_cxx::__ops::_Iter_comp_val<std::less<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>>
                  ((__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>)__first,
                   lVar21,(long)ppVar10,__value,__comp);
      }
      queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_170 + -1;
      if ((vec<2U,_float> *)lVar20 != vq.m_weightedVectors.m_p) {
        std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                  (&queue,(value_type_conflict *)&vq);
      }
      if (vectors.m_size != 0) break;
LAB_001684ce:
      vector<crnlib::vec<2U,_float>_>::push_back(&vectors,(vec<2U,_float> *)ppVar12);
      vector<unsigned_int>::push_back(&weights,(uint *)((ppVar12->first).m_s + 2));
    }
    fVar2 = (ppVar12->first).m_s[0];
    if ((fVar2 != vectors.m_p[vectors.m_size - 1].m_s[0]) ||
       (NAN(fVar2) || NAN(vectors.m_p[vectors.m_size - 1].m_s[0]))) goto LAB_001684ce;
    fVar2 = (ppVar12->first).m_s[1];
    if ((fVar2 != vectors.m_p[vectors.m_size - 1].m_s[1]) ||
       (NAN(fVar2) || NAN(vectors.m_p[vectors.m_size - 1].m_s[1]))) goto LAB_001684ce;
    uVar9 = (uint)(ppVar12->first).m_s[2];
    uVar13 = uVar9 + weights.m_p[weights.m_size - 1];
    if (CARRY4(uVar9,weights.m_p[weights.m_size - 1])) {
      uVar13 = 0xffffffff;
    }
    weights.m_p[weights.m_size - 1] = uVar13;
  } while( true );
code_r0x0016820e:
  if (nodes.m_capacity <= nodes.m_size) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&nodes,nodes.m_size + 1,true,0x10,vector<Node>::object_mover,
               false);
  }
  nodes.m_p[nodes.m_size].p = ppVar18;
  nodes.m_p[nodes.m_size].pEnd = ppVar17;
  nodes.m_size = nodes.m_size + 1;
  goto LAB_001681d6;
}

Assistant:

void dxt_hc::determine_alpha_endpoints() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<std::pair<vec2F, uint> > endpoints;
  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    for (uint t = 0; t < m_tiles.size(); t++) {
      if (m_tiles[t].pixels.size())
        endpoints.push_back(std::make_pair(m_tiles[t].alpha_endpoints[a], m_tiles[t].pixels.size()));
    }
  }

  struct Node {
    std::pair<vec2F, uint> *p, *pEnd;
    Node (std::pair<vec2F, uint>* begin, std::pair<vec2F, uint>* end) : p(begin), pEnd(end) {}
    bool operator<(const Node& other) const { return *p > *other.p; }
    static void sort_task(uint64 data, void* ptr) { std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd); }
  };

  crnlib::vector<Node> nodes;
  Node node(0, endpoints.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<Node> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  crnlib::vector<vec2F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(endpoints.size());
  weights.reserve(endpoints.size());
  while (queue.size()) {
    Node node = queue.top();
    std::pair<vec2F, uint>* endpoint = node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    if (!vectors.size() || endpoint->first != vectors.back()) {
      vectors.push_back(endpoint->first);
      weights.push_back(endpoint->second);
    } else if (weights.back() > UINT_MAX - endpoint->second) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += endpoint->second;
    }
  }

  tree_clusterizer<vec2F> vq;
  vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_alpha_endpoint_codebook_size), false, m_pTask_pool);
  m_alpha_clusters.resize(vq.get_codebook_size());

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_clusters_task, i, &vq);
  m_pTask_pool->join();

  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    uint component_index = m_params.m_alpha_component_indices[a];
    for (uint t = 0; t < m_num_blocks; t++) {
      crnlib::vector<color_quad_u8>& source = m_tiles[t].pixels;
      if (source.size()) {
        crnlib::vector<color_quad_u8>& destination = m_alpha_clusters[m_tiles[t].cluster_indices[cAlpha0 + a]].pixels;
        for (uint p = 0; p < source.size(); p++)
          destination.push_back(color_quad_u8(source[p][component_index]));
      }
    }
  }

  for (uint b = 0; b < m_num_blocks; b++) {
    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cAlpha0 + a];
      m_endpoint_indices[b].component[cAlpha0 + a] = cluster_index;
      if (!(m_has_subblocks && b & 1))
        m_alpha_clusters[cluster_index].blocks[cAlpha0 + a].push_back(b);
    }
  }

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_codebook_task, i, NULL);
  m_pTask_pool->join();
}